

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_2::CullFaceTestCase::test(CullFaceTestCase *this)

{
  uint mode;
  long lVar1;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb45,
             0x405);
  lVar1 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    mode = *(uint *)((long)&DAT_01c0db68 + lVar1);
    glu::CallLogWrapper::glCullFace(&(this->super_ApiCase).super_CallLogWrapper,mode);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb45,
               (ulong)mode);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_CULL_FACE_MODE, GL_BACK);
		expectError(GL_NO_ERROR);

		const GLenum cullFaces[] = {GL_FRONT, GL_BACK, GL_FRONT_AND_BACK};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cullFaces); ndx++)
		{
			glCullFace(cullFaces[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_CULL_FACE_MODE, cullFaces[ndx]);
			expectError(GL_NO_ERROR);
		}
	}